

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void ZSTD_setBasePrices(optState_t *optPtr,int optLevel)

{
  int iVar1;
  U32 UVar2;
  int in_ESI;
  optState_t *in_RDI;
  U32 in_stack_ffffffffffffffe4;
  U32 local_18;
  U32 local_14;
  U32 local_10;
  
  iVar1 = ZSTD_compressedLiterals(in_RDI);
  if (iVar1 != 0) {
    if (in_ESI == 0) {
      local_10 = ZSTD_bitWeight(0);
    }
    else {
      local_10 = ZSTD_fracWeight(in_stack_ffffffffffffffe4);
    }
    in_RDI->litSumBasePrice = local_10;
  }
  if (in_ESI == 0) {
    local_14 = ZSTD_bitWeight(0);
  }
  else {
    local_14 = ZSTD_fracWeight(in_stack_ffffffffffffffe4);
  }
  in_RDI->litLengthSumBasePrice = local_14;
  if (in_ESI == 0) {
    local_18 = ZSTD_bitWeight(0);
  }
  else {
    local_18 = ZSTD_fracWeight(in_stack_ffffffffffffffe4);
  }
  in_RDI->matchLengthSumBasePrice = local_18;
  if (in_ESI == 0) {
    UVar2 = ZSTD_bitWeight(0);
  }
  else {
    UVar2 = ZSTD_fracWeight(in_stack_ffffffffffffffe4);
  }
  in_RDI->offCodeSumBasePrice = UVar2;
  return;
}

Assistant:

static void ZSTD_setBasePrices(optState_t* optPtr, int optLevel)
{
    if (ZSTD_compressedLiterals(optPtr))
        optPtr->litSumBasePrice = WEIGHT(optPtr->litSum, optLevel);
    optPtr->litLengthSumBasePrice = WEIGHT(optPtr->litLengthSum, optLevel);
    optPtr->matchLengthSumBasePrice = WEIGHT(optPtr->matchLengthSum, optLevel);
    optPtr->offCodeSumBasePrice = WEIGHT(optPtr->offCodeSum, optLevel);
}